

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O3

void luabridge::detail::CFunc::addGetter(lua_State *L,char *name,int tableIndex)

{
  int iVar1;
  
  iVar1 = lua_type(L,tableIndex);
  if (iVar1 != 5) {
    __assert_fail("lua_istable(L, tableIndex)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                  ,0x17,
                  "static void luabridge::detail::CFunc::addGetter(lua_State *, const char *, int)")
    ;
  }
  iVar1 = lua_iscfunction(L,-1);
  if (iVar1 != 0) {
    lua_rawgetp(L,tableIndex,(void *)0x6e7);
    lua_pushvalue(L,-2);
    iVar1 = lua_type(L,-2);
    if (iVar1 == 5) {
      iVar1 = lua_absindex(L,-2);
      lua_pushstring(L,name);
      lua_rotate(L,-2,1);
      lua_rawset(L,iVar1);
      lua_settop(L,-3);
      return;
    }
    __assert_fail("lua_istable(L, index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/LuaHelpers.h"
                  ,100,"void luabridge::rawsetfield(lua_State *, int, const char *)");
  }
  __assert_fail("lua_iscfunction(L, -1)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                ,0x18,
                "static void luabridge::detail::CFunc::addGetter(lua_State *, const char *, int)");
}

Assistant:

static void addGetter(lua_State* L, const char* name, int tableIndex)
    {
        assert(lua_istable(L, tableIndex));
        assert(lua_iscfunction(L, -1)); // Stack: getter

        lua_rawgetp(L, tableIndex, getPropgetKey()); // Stack: getter, propget table (pg)
        lua_pushvalue(L, -2); // Stack: getter, pg, getter
        rawsetfield(L, -2, name); // Stack: getter, pg
        lua_pop(L, 2); // Stack: -
    }